

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

GatherLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_gather(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  GatherLayerParams *pGVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_gather(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_gather(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pGVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::GatherLayerParams>(arena);
    (this->layer_).gather_ = pGVar2;
  }
  return (GatherLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GatherLayerParams* NeuralNetworkLayer::_internal_mutable_gather() {
  if (!_internal_has_gather()) {
    clear_layer();
    set_has_gather();
    layer_.gather_ = CreateMaybeMessage< ::CoreML::Specification::GatherLayerParams >(GetArenaForAllocation());
  }
  return layer_.gather_;
}